

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O3

CK_STATE __thiscall Session::getState(Session *this)

{
  bool bVar1;
  CK_STATE CVar2;
  
  bVar1 = Token::isSOLoggedIn(this->token);
  CVar2 = 4;
  if (!bVar1) {
    bVar1 = Token::isUserLoggedIn(this->token);
    if (bVar1) {
      CVar2 = (ulong)this->isReadWrite * 2 + 1;
    }
    else {
      CVar2 = (CK_STATE)((uint)this->isReadWrite * 2);
    }
  }
  return CVar2;
}

Assistant:

CK_STATE Session::getState()
{
	if (token->isSOLoggedIn())
	{
		return CKS_RW_SO_FUNCTIONS;
	}

	if (token->isUserLoggedIn())
	{
		if (isRW())
		{
			return CKS_RW_USER_FUNCTIONS;
		}
		else
		{
			return CKS_RO_USER_FUNCTIONS;
		}
	}

	if (isRW())
	{
		return CKS_RW_PUBLIC_SESSION;
	}
	else
	{
		return CKS_RO_PUBLIC_SESSION;
	}
}